

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::CodeHolder::attach(CodeHolder *this,BaseEmitter *emitter)

{
  Error EVar1;
  uint uVar2;
  Error extraout_EAX;
  CodeHolder *pCVar3;
  CodeHolder *extraout_RAX;
  ulong uVar4;
  size_t __n;
  size_t extraout_RDX;
  CodeHolder *pCVar5;
  CodeHolder *pCVar6;
  CodeHolder *pCVar7;
  long lVar8;
  long lVar9;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar1 = 2;
  }
  else if ((byte)(emitter->_emitterType + ~kCompiler) < 0xfd) {
    EVar1 = 3;
  }
  else {
    uVar2._0_1_ = (this->_environment)._arch;
    uVar2._1_1_ = (this->_environment)._subArch;
    uVar2._2_1_ = (this->_environment)._vendor;
    uVar2._3_1_ = (this->_environment)._platform;
    uVar4 = (ulong)uVar2;
    if ((emitter->_archMask >> (uVar4 & 0x3f) & 1) == 0) {
      EVar1 = 4;
    }
    else if (emitter->_code == (CodeHolder *)0x0) {
      if (*(int *)&this->field_0xd4 == *(int *)&this->field_0xd0) {
        uVar4 = 1;
        EVar1 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_emitters,&this->_allocator,8,1);
        if (EVar1 != 0) {
          return EVar1;
        }
      }
      pCVar5 = this;
      pCVar7 = (CodeHolder *)emitter;
      EVar1 = (*emitter->_vptr_BaseEmitter[0x10])();
      if (EVar1 == 0) {
        if (emitter->_code == this) {
          if (*(uint *)&this->field_0xd0 < *(uint *)&this->field_0xd4) {
            *(BaseEmitter **)(*(long *)&this->_emitters + (ulong)*(uint *)&this->field_0xd0 * 8) =
                 emitter;
            *(int *)&this->field_0xd0 = *(int *)&this->field_0xd0 + 1;
            return 0;
          }
        }
        else {
          attach();
        }
        attach();
        if (pCVar5 == (CodeHolder *)0x0) {
          EVar1 = 2;
        }
        else if ((CodeHolder *)pCVar5->_logger == pCVar7) {
          if ((char)pCVar5->field_0x9 < '\0') {
            EVar1 = 0;
            pCVar6 = pCVar5;
          }
          else {
            pCVar6 = pCVar7;
            EVar1 = (**(_func_int **)((long)pCVar5->_environment + 0x88))(pCVar5);
          }
          pCVar3 = (CodeHolder *)(ulong)*(uint *)&pCVar7->field_0xd0;
          if (pCVar3 != (CodeHolder *)0x0) {
            uVar4 = *(ulong *)&pCVar7->_emitters;
            __n = (ulong)(*(uint *)&pCVar7->field_0xd0 - 1) << 3;
            pCVar6 = (CodeHolder *)0x0;
            do {
              if (*(CodeHolder **)(uVar4 + (long)pCVar6 * 8) == pCVar5) goto LAB_00118253;
              pCVar6 = (CodeHolder *)&(pCVar6->_environment)._subArch;
              __n = __n - 8;
            } while (pCVar3 != pCVar6);
          }
          do {
            detach();
            pCVar3 = extraout_RAX;
            __n = extraout_RDX;
LAB_00118253:
            lVar8 = 0xffffffff;
          } while (pCVar6 == (CodeHolder *)0xffffffff);
          if (pCVar3 <= pCVar6) {
            detach();
            *(CodeHolder **)(lVar8 + 0x30) = pCVar6;
            uVar2 = *(uint *)(lVar8 + 0xd0);
            EVar1 = extraout_EAX;
            if ((ulong)uVar2 != 0) {
              lVar8 = *(long *)(lVar8 + 200);
              lVar9 = 0;
              do {
                EVar1 = (**(code **)(**(long **)(lVar8 + lVar9) + 0x90))();
                lVar9 = lVar9 + 8;
              } while ((ulong)uVar2 << 3 != lVar9);
            }
            return EVar1;
          }
          uVar2 = (int)pCVar3 - 1;
          *(uint *)&pCVar7->field_0xd0 = uVar2;
          if ((CodeHolder *)(ulong)uVar2 != pCVar6) {
            memmove((void *)(uVar4 + (long)pCVar6 * 8),(void *)(uVar4 + (long)pCVar6 * 8 + 8),__n);
          }
          pCVar5->_logger = (Logger *)0x0;
        }
        else {
          EVar1 = 3;
        }
        return EVar1;
      }
    }
    else {
      EVar1 = (uint)(emitter->_code != this) * 3;
    }
  }
  return EVar1;
}

Assistant:

Error CodeHolder::attach(BaseEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  // Invalid emitter, this should not be possible.
  EmitterType type = emitter->emitterType();
  if (ASMJIT_UNLIKELY(type == EmitterType::kNone || uint32_t(type) > uint32_t(EmitterType::kMaxValue)))
    return DebugUtils::errored(kErrorInvalidState);

  uint64_t archMask = emitter->_archMask;
  if (ASMJIT_UNLIKELY(!(archMask & (uint64_t(1) << uint32_t(arch())))))
    return DebugUtils::errored(kErrorInvalidArch);

  // This is suspicious, but don't fail if `emitter` is already attached
  // to this code holder. This is not error, but it's not recommended.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Reserve the space now as we cannot fail after `onAttach()` succeeded.
  ASMJIT_PROPAGATE(_emitters.willGrow(&_allocator, 1));
  ASMJIT_PROPAGATE(emitter->onAttach(this));

  // Connect CodeHolder <-> BaseEmitter.
  ASMJIT_ASSERT(emitter->_code == this);
  _emitters.appendUnsafe(emitter);

  return kErrorOk;
}